

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LateMaterialization::GetExpression
          (LateMaterialization *this,LogicalOperator *op,idx_t column_index)

{
  LogicalGet *this_00;
  vector<duckdb::ColumnIndex,_true> *this_01;
  const_reference index;
  string *psVar1;
  LogicalType *args_1;
  reference this_02;
  pointer pEVar2;
  InternalException *this_03;
  size_type in_RCX;
  _func_int **local_60;
  string column_name;
  ColumnBinding local_38;
  
  if (*(char *)(column_index + 8) == '\x01') {
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)(column_index + 0x28),in_RCX);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(this,pEVar2);
  }
  else {
    if (*(char *)(column_index + 8) != '\x19') {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&column_name,
                 "Unsupported operator type for LateMaterialization::GetExpression",
                 (allocator *)&local_38);
      InternalException::InternalException(this_03,&column_name);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)column_index);
    this_01 = LogicalGet::GetColumnIds(this_00);
    index = vector<duckdb::ColumnIndex,_true>::get<true>(this_01,in_RCX);
    psVar1 = LogicalGet::GetColumnName_abi_cxx11_(this_00,index);
    ::std::__cxx11::string::string((string *)&column_name,(string *)psVar1);
    args_1 = LogicalGet::GetColumnType(this_00,index);
    local_38.table_index = this_00->table_index;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string&,duckdb::LogicalType_const&,duckdb::ColumnBinding>
              ((duckdb *)&local_60,&column_name,args_1,&local_38);
    (this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         local_60;
    ::std::__cxx11::string::~string((string *)&column_name);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LateMaterialization::GetExpression(LogicalOperator &op, idx_t column_index) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET: {
		auto &get = op.Cast<LogicalGet>();
		auto &column_id = get.GetColumnIds()[column_index];
		auto column_name = get.GetColumnName(column_id);
		auto &column_type = get.GetColumnType(column_id);
		auto expr =
		    make_uniq<BoundColumnRefExpression>(column_name, column_type, ColumnBinding(get.table_index, column_index));
		return std::move(expr);
	}
	case LogicalOperatorType::LOGICAL_PROJECTION:
		return op.expressions[column_index]->Copy();
	default:
		throw InternalException("Unsupported operator type for LateMaterialization::GetExpression");
	}
}